

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O3

bool handleGetBulkRequestPDU
               (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
               deque<VarBind,_std::allocator<VarBind>_> *varbindList,
               deque<VarBind,_std::allocator<VarBind>_> *outResponseList,uint nonRepeaters,
               uint maxRepititions)

{
  ASN_TYPE *pAVar1;
  _Map_pointer ppVVar2;
  SortableOIDType *this;
  undefined8 uVar3;
  SortableOIDType *pSVar4;
  uint uVar5;
  reference pVVar6;
  ValueCallback *pVVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  shared_ptr<BER_CONTAINER> value;
  shared_ptr<BER_CONTAINER> value_1;
  size_t foundAt;
  ValueCallback local_a8;
  deque<VarBind,std::allocator<VarBind>> *local_90;
  _Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *local_88;
  _Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *local_80;
  uint local_74;
  ulong local_70;
  undefined1 local_68 [16];
  OIDType *local_58;
  SortableOIDType *pSStack_50;
  _Alloc_hider local_40;
  ulong local_38;
  
  local_70 = (ulong)nonRepeaters;
  local_90 = (deque<VarBind,std::allocator<VarBind>> *)outResponseList;
  local_80 = (_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)varbindList;
  local_74 = maxRepititions;
  if (nonRepeaters == 0) {
    uVar9 = 0;
  }
  else {
    local_88 = &(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                super__Deque_impl_data._M_start;
    local_38 = (ulong)nonRepeaters;
    uVar8 = 0;
    do {
      ppVVar2 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      uVar9 = local_38;
      if (((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
          ((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
          (((long)ppVVar2 -
            (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppVVar2 == (_Map_pointer)0x0)) * 10 <= uVar8) break;
      pVVar6 = std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator[](local_88,uVar8);
      pVVar7 = ValueCallback::findCallback
                         (callbacks,
                          (pVVar6->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,true,0,(size_t *)0x0);
      if (pVVar7 == (ValueCallback *)0x0) {
        local_a8.OID = (SortableOIDType *)operator_new(0x20);
        ((local_a8.OID)->super_OIDType).super_BER_CONTAINER._type = 1;
        ((local_a8.OID)->super_OIDType).super_BER_CONTAINER._length = 1;
        ((local_a8.OID)->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00115900;
        local_a8._vptr_ValueCallback = (_func_int **)&((local_a8.OID)->super_OIDType).valid;
        *(undefined ***)&((local_a8.OID)->super_OIDType).valid = &PTR__BER_CONTAINER_00114fa8;
        ((local_a8.OID)->super_OIDType)._value._M_dataplus._M_p = (pointer)0x82;
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  (local_90,pVVar6,(shared_ptr<ImplicitNullType> *)&local_a8);
      }
      else {
        ValueCallback::getValueForCallback(&local_a8,pVVar7);
        if ((element_type *)local_a8._vptr_ValueCallback == (element_type *)0x0) {
          local_68._0_4_ = 5;
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    (local_90,&pVVar7->OID,(ERROR_STATUS_WITH_VALUE *)local_68);
        }
        else {
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<VarBind_const&,std::shared_ptr<BER_CONTAINER>&>
                    (local_90,pVVar6,(shared_ptr<BER_CONTAINER> *)&local_a8);
        }
      }
      varbindList = (deque<VarBind,_std::allocator<VarBind>_> *)local_80;
      if (local_a8.OID != (SortableOIDType *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.OID);
      }
      uVar8 = uVar8 + 1;
      uVar9 = local_38;
    } while (local_38 != uVar8);
  }
  ppVVar2 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  uVar8 = ((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
          ((long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
          (((long)ppVVar2 -
            (long)(varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppVVar2 == (_Map_pointer)0x0)) * 10;
  if ((uVar9 < uVar8) &&
     (uVar5 = (int)uVar8 - (int)local_70,
     local_88 = (_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)(ulong)uVar5, uVar5 != 0)) {
    local_80 = &(((_Deque_base<VarBind,_std::allocator<VarBind>_> *)&local_80->_M_cur)->_M_impl).
                super__Deque_impl_data._M_start;
    uVar9 = 0;
    do {
      pVVar6 = std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator[]
                         (local_80,(ulong)(uint)((int)uVar9 + (int)local_70));
      local_a8._vptr_ValueCallback =
           (_func_int **)
           (pVVar6->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_a8.OID = (SortableOIDType *)
                     (pVVar6->oid).super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_a8.OID != (SortableOIDType *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pAVar1 = &((local_a8.OID)->super_OIDType).super_BER_CONTAINER._type;
          *pAVar1 = *pAVar1 + 1;
          UNLOCK();
        }
        else {
          pAVar1 = &((local_a8.OID)->super_OIDType).super_BER_CONTAINER._type;
          *pAVar1 = *pAVar1 + 1;
        }
      }
      local_40._M_p = (pointer)0x0;
      if (local_74 != 0) {
        uVar5 = 1;
        while (pVVar7 = ValueCallback::findCallback
                                  (callbacks,(OIDType *)local_a8._vptr_ValueCallback,true,
                                   (size_t)local_40._M_p,(size_t *)&local_40),
              pVVar7 != (ValueCallback *)0x0) {
          ValueCallback::getValueForCallback((ValueCallback *)local_68,pVVar7);
          uVar3 = local_68._0_8_;
          if ((bool *)local_68._0_8_ == (bool *)0x0) {
            local_58 = (OIDType *)CONCAT44(local_58._4_4_,5);
            std::deque<VarBind,std::allocator<VarBind>>::
            emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                      (local_90,&pVVar7->OID,(ERROR_STATUS_WITH_VALUE *)&local_58);
          }
          else {
            std::deque<VarBind,std::allocator<VarBind>>::
            emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                      (local_90,&pVVar7->OID,(shared_ptr<BER_CONTAINER> *)local_68);
            OIDType::cloneOID((OIDType *)&local_58);
            pSVar4 = pSStack_50;
            local_a8._vptr_ValueCallback = (_func_int **)local_58;
            this = local_a8.OID;
            local_58 = (element_type *)0x0;
            pSStack_50 = (SortableOIDType *)0x0;
            local_a8.OID = pSVar4;
            if ((this != (SortableOIDType *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this),
               pSStack_50 != (SortableOIDType *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_50);
            }
          }
          if ((SortableOIDType *)local_68._8_8_ != (SortableOIDType *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
          if (((bool *)uVar3 == (bool *)0x0) ||
             (bVar10 = local_74 <= uVar5, uVar5 = uVar5 + 1, bVar10)) goto LAB_00109826;
        }
        local_68._8_8_ = operator_new(0x20);
        (((SortableOIDType *)local_68._8_8_)->super_OIDType).super_BER_CONTAINER._type = 1;
        (((SortableOIDType *)local_68._8_8_)->super_OIDType).super_BER_CONTAINER._length = 1;
        (((SortableOIDType *)local_68._8_8_)->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER
             = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115900;
        local_68._0_8_ = &(((SortableOIDType *)local_68._8_8_)->super_OIDType).valid;
        *(undefined ***)&(((SortableOIDType *)local_68._8_8_)->super_OIDType).valid =
             &PTR__BER_CONTAINER_00114fa8;
        (((SortableOIDType *)local_68._8_8_)->super_OIDType)._value._M_dataplus._M_p = (pointer)0x82
        ;
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<std::shared_ptr<OIDType>&,std::shared_ptr<ImplicitNullType>>
                  (local_90,(shared_ptr<OIDType> *)&local_a8,
                   (shared_ptr<ImplicitNullType> *)local_68);
        if ((SortableOIDType *)local_68._8_8_ != (SortableOIDType *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        }
      }
LAB_00109826:
      if (local_a8.OID != (SortableOIDType *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.OID);
      }
      uVar9 = uVar9 + 1;
    } while ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)uVar9 != local_88);
  }
  return true;
}

Assistant:

bool handleGetBulkRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, unsigned int nonRepeaters, unsigned int maxRepititions){
    // from https://tools.ietf.org/html/rfc1448#page-18
    SNMP_LOGD("handleGetBulkRequestPDU, nonRepeaters:%d, maxRepititions:%d, varbindSize:%ld\n", nonRepeaters, maxRepititions, varbindList.size());
    // nonRepeaters is MIN(nonRepeaters, varbindList.size()
    // repeaters is the extra of varbindList.size() - nonRepeaters) which get 'walked' maxRepititions times

    SNMP_LOGD("handling nonRepeaters\n");
    if(nonRepeaters > 0){
        // handle GET normally, but mark endOfMibView if not found
        for(unsigned int i = 0; i < nonRepeaters && i < varbindList.size(); i++){
            const VarBind& requestVarBind = varbindList[i];
            ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), true);
            if(!callback){
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                continue;
            }

            auto value = ValueCallback::getValueForCallback(callback);
            if(!value){
                SNMP_LOGD("Couldn't get value for callback\n");
                outResponseList.emplace_back(callback->OID, GEN_ERR);
                continue;   
            }
            outResponseList.emplace_back(requestVarBind, value);
        }
    }

    if(varbindList.size() > nonRepeaters){
        // For each extra varbind, WALK that tree until maxRepititions or endOfMibView
        SNMP_LOGD("handling repeaters\n");
        unsigned int repeatingVarBinds = varbindList.size() - nonRepeaters;
        
        for(unsigned int i = 0; i < repeatingVarBinds; i++){
            // Store first varbind to get for each line
            auto oid = varbindList[i+nonRepeaters].oid;
            size_t foundAt = 0;

            for(unsigned int j = 0; j < maxRepititions; j++){
                SNMP_LOGD("finding next callback for OID: %s\n", oid->string().c_str());
                ValueCallback* callback = ValueCallback::findCallback(callbacks, oid.get(), true, foundAt, &foundAt);
                if(!callback){
                    // We're done, mark endOfMibView
                    outResponseList.emplace_back(oid, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
                    break;
                }

                auto value = ValueCallback::getValueForCallback(callback);

                if(!value){
                    SNMP_LOGD("Couldn't get value for callback\n");
                    outResponseList.emplace_back(callback->OID, GEN_ERR);
                    break;   
                }
                
                outResponseList.emplace_back(callback->OID, value);

                // set next oid to callback OID
                oid = callback->OID->cloneOID();
            }

            //SNMP_LOGD("Walked tree of %s, %d times", (*varbindList)[i+nonRepeaters]->oid->_value, j);
        }
    }

    return true;
}